

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

void yaml_emitter_delete(yaml_emitter_t *emitter)

{
  yaml_char_t *pyVar1;
  uchar *__ptr;
  yaml_emitter_state_t *__ptr_00;
  yaml_event_t *pyVar2;
  int *__ptr_01;
  yaml_tag_directive_t *__ptr_02;
  yaml_tag_directive_t *pyVar3;
  
  if (emitter != (yaml_emitter_t *)0x0) {
    pyVar1 = (emitter->buffer).start;
    if (pyVar1 != (yaml_char_t *)0x0) {
      free(pyVar1);
    }
    (emitter->buffer).start = (yaml_char_t *)0x0;
    (emitter->buffer).end = (yaml_char_t *)0x0;
    (emitter->buffer).pointer = (yaml_char_t *)0x0;
    __ptr = (emitter->raw_buffer).start;
    if (__ptr != (uchar *)0x0) {
      free(__ptr);
    }
    (emitter->raw_buffer).start = (uchar *)0x0;
    (emitter->raw_buffer).end = (uchar *)0x0;
    (emitter->raw_buffer).pointer = (uchar *)0x0;
    __ptr_00 = (emitter->states).start;
    if (__ptr_00 != (yaml_emitter_state_t *)0x0) {
      free(__ptr_00);
    }
    (emitter->states).start = (yaml_emitter_state_t *)0x0;
    (emitter->states).end = (yaml_emitter_state_t *)0x0;
    (emitter->states).top = (yaml_emitter_state_t *)0x0;
    while (pyVar2 = (emitter->events).head, pyVar2 != (emitter->events).tail) {
      (emitter->events).head = pyVar2 + 1;
      yaml_event_delete(pyVar2);
    }
    pyVar2 = (emitter->events).start;
    if (pyVar2 != (yaml_event_t *)0x0) {
      free(pyVar2);
    }
    (emitter->events).head = (yaml_event_t *)0x0;
    (emitter->events).tail = (yaml_event_t *)0x0;
    (emitter->events).start = (yaml_event_t *)0x0;
    (emitter->events).end = (yaml_event_t *)0x0;
    __ptr_01 = (emitter->indents).start;
    if (__ptr_01 != (int *)0x0) {
      free(__ptr_01);
    }
    (emitter->indents).start = (int *)0x0;
    (emitter->indents).end = (int *)0x0;
    (emitter->indents).top = (int *)0x0;
    while( true ) {
      __ptr_02 = (emitter->tag_directives).start;
      pyVar3 = (emitter->tag_directives).top;
      if (__ptr_02 == pyVar3) break;
      (emitter->tag_directives).top = pyVar3 + -1;
      pyVar1 = pyVar3[-1].prefix;
      if (pyVar3[-1].handle != (yaml_char_t *)0x0) {
        free(pyVar3[-1].handle);
      }
      if (pyVar1 != (yaml_char_t *)0x0) {
        free(pyVar1);
      }
    }
    if (__ptr_02 != (yaml_tag_directive_t *)0x0) {
      free(__ptr_02);
    }
    (emitter->tag_directives).start = (yaml_tag_directive_t *)0x0;
    (emitter->tag_directives).end = (yaml_tag_directive_t *)0x0;
    (emitter->tag_directives).top = (yaml_tag_directive_t *)0x0;
    if (emitter->anchors != (yaml_anchors_t *)0x0) {
      free(emitter->anchors);
    }
    memset(emitter,0,0x1b0);
    return;
  }
  __assert_fail("emitter",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                ,0x18a,"void yaml_emitter_delete(yaml_emitter_t *)");
}

Assistant:

YAML_DECLARE(void)
yaml_emitter_delete(yaml_emitter_t *emitter)
{
    assert(emitter);    /* Non-NULL emitter object expected. */

    BUFFER_DEL(emitter, emitter->buffer);
    BUFFER_DEL(emitter, emitter->raw_buffer);
    STACK_DEL(emitter, emitter->states);
    while (!QUEUE_EMPTY(emitter, emitter->events)) {
        yaml_event_delete(&DEQUEUE(emitter, emitter->events));
    }
    QUEUE_DEL(emitter, emitter->events);
    STACK_DEL(emitter, emitter->indents);
    while (!STACK_EMPTY(empty, emitter->tag_directives)) {
        yaml_tag_directive_t tag_directive = POP(emitter, emitter->tag_directives);
        yaml_free(tag_directive.handle);
        yaml_free(tag_directive.prefix);
    }
    STACK_DEL(emitter, emitter->tag_directives);
    yaml_free(emitter->anchors);

    memset(emitter, 0, sizeof(yaml_emitter_t));
}